

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_filepath.hpp
# Opt level: O3

void __thiscall iutest::detail::iuFilePath::iuFilePath(iuFilePath *this,string *path)

{
  pointer pcVar1;
  char *pcVar2;
  char *__s;
  char *pcVar3;
  char cVar4;
  char *pcVar5;
  
  (this->m_path)._M_dataplus._M_p = (pointer)&(this->m_path).field_2;
  pcVar1 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + path->_M_string_length);
  pcVar5 = (this->m_path)._M_dataplus._M_p;
  pcVar2 = (char *)(this->m_path)._M_string_length;
  __s = (char *)operator_new__((ulong)(pcVar2 + 1));
  cVar4 = *pcVar5;
  pcVar3 = __s;
  while (cVar4 != '\0') {
    *pcVar3 = cVar4;
    if (*pcVar5 == '/') {
      do {
        cVar4 = pcVar5[1];
        pcVar5 = pcVar5 + 1;
      } while (cVar4 == '/');
    }
    else {
      cVar4 = pcVar5[1];
      pcVar5 = pcVar5 + 1;
    }
    pcVar3 = pcVar3 + 1;
  }
  *pcVar3 = '\0';
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)this,0,pcVar2,(ulong)__s);
  operator_delete__(__s);
  return;
}

Assistant:

explicit iuFilePath(const ::std::string& path) : m_path(path)
    {
        Normalize();
    }